

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

String * __thiscall
capnp::JsonCodec::encode<capnp::TestJsonAnnotations::Reader>
          (String *__return_storage_ptr__,JsonCodec *this,Reader *value)

{
  Reader *pRVar1;
  Reader local_a8;
  Reader local_78;
  undefined1 auStack_30 [8];
  Type type;
  Reader *value_local;
  JsonCodec *this_local;
  
  type.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)value;
  _auStack_30 = capnp::Type::from<capnp::TestJsonAnnotations::Reader&>(value);
  pRVar1 = kj::fwd<capnp::TestJsonAnnotations::Reader>
                     ((NoInfer<capnp::TestJsonAnnotations::Reader> *)type.field_4.schema);
  local_a8._reader.segment = (pRVar1->_reader).segment;
  local_a8._reader.capTable = (pRVar1->_reader).capTable;
  local_a8._reader.data = (pRVar1->_reader).data;
  local_a8._reader.pointers = (pRVar1->_reader).pointers;
  local_a8._reader.dataSize = (pRVar1->_reader).dataSize;
  local_a8._reader.pointerCount = (pRVar1->_reader).pointerCount;
  local_a8._reader._38_2_ = *(undefined2 *)&(pRVar1->_reader).field_0x26;
  local_a8._reader.nestingLimit = (pRVar1->_reader).nestingLimit;
  local_a8._reader._44_4_ = *(undefined4 *)&(pRVar1->_reader).field_0x2c;
  DynamicValue::Reader::Reader<capnp::TestJsonAnnotations::Reader,capnp::DynamicStruct::Reader>
            (&local_78,&local_a8);
  encode(__return_storage_ptr__,this,&local_78,_auStack_30);
  DynamicValue::Reader::~Reader(&local_78);
  return __return_storage_ptr__;
}

Assistant:

kj::String JsonCodec::encode(T&& value) const {
  Type type = Type::from(value);
  typedef FromAny<kj::Decay<T>> Base;
  return encode(DynamicValue::Reader(ReaderFor<Base>(kj::fwd<T>(value))), type);
}